

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::append<char_const*,void>
          (SmallVectorImpl<unsigned_char> *this,char *in_start,char *in_end)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  char *in_end_local;
  char *in_start_local;
  SmallVectorImpl<unsigned_char> *this_local;
  
  uVar2 = std::distance<char_const*>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<unsigned_char,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_char,_true>,sVar3 + uVar2);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<unsigned_char,true>::uninitialized_copy<char_const*,unsigned_char*>
            (in_start,in_end,(uchar *)((long)pvVar1 + sVar3));
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }